

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.cc
# Opt level: O1

int __thiscall
webrtc::Resampler::ResetIfNeeded(Resampler *this,int inFreq,int outFreq,size_t num_channels)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ResamplerMode RVar4;
  Resampler *pRVar5;
  WebRtcSpl_State48khzTo16khz *pWVar6;
  WebRtcSpl_State8khzTo22khz *state;
  WebRtcSpl_State16khzTo48khz *pWVar7;
  undefined8 *puVar8;
  WebRtcSpl_State22khzTo8khz *pWVar9;
  WebRtcSpl_State16khzTo22khz *state_00;
  WebRtcSpl_State22khzTo16khz *pWVar10;
  int iVar11;
  uint uVar12;
  undefined *puVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  
  if (((inFreq / 1000 == this->my_in_frequency_khz_) &&
      (outFreq / 1000 == this->my_out_frequency_khz_)) && (this->num_channels_ == num_channels)) {
    return 0;
  }
  if (num_channels - 3 < 0xfffffffffffffffe) {
    return -1;
  }
  this->num_channels_ = num_channels;
  if (this->state1_ != (void *)0x0) {
    free(this->state1_);
    this->state1_ = (void *)0x0;
  }
  if (this->state2_ != (void *)0x0) {
    free(this->state2_);
    this->state2_ = (void *)0x0;
  }
  if (this->state3_ != (void *)0x0) {
    free(this->state3_);
    this->state3_ = (void *)0x0;
  }
  if (this->in_buffer_ != (int16_t *)0x0) {
    free(this->in_buffer_);
    this->in_buffer_ = (int16_t *)0x0;
  }
  if (this->out_buffer_ != (int16_t *)0x0) {
    free(this->out_buffer_);
    this->out_buffer_ = (int16_t *)0x0;
  }
  pRVar5 = this->slave_left_;
  if (pRVar5 != (Resampler *)0x0) {
    ~Resampler(pRVar5);
    operator_delete(pRVar5);
    this->slave_left_ = (Resampler *)0x0;
  }
  pRVar5 = this->slave_right_;
  if (pRVar5 != (Resampler *)0x0) {
    ~Resampler(pRVar5);
    operator_delete(pRVar5);
    this->slave_right_ = (Resampler *)0x0;
  }
  this->in_buffer_size_max_ = 0;
  this->out_buffer_size_max_ = 0;
  this->in_buffer_size_ = 0;
  this->out_buffer_size_ = 0;
  iVar14 = (int)((long)inFreq % (long)outFreq);
  uVar1 = (long)inFreq % (long)outFreq;
  iVar11 = outFreq;
  uVar3 = (ulong)(uint)outFreq;
  while (uVar2 = uVar1, iVar14 != 0) {
    iVar11 = (int)uVar2;
    uVar1 = (long)(int)uVar3 % (long)iVar11;
    iVar14 = (int)uVar1;
    uVar3 = uVar2;
  }
  this->my_in_frequency_khz_ = inFreq / 1000;
  this->my_out_frequency_khz_ = outFreq / 1000;
  uVar15 = inFreq / iVar11;
  uVar16 = outFreq / iVar11;
  if (this->num_channels_ == 2) {
    pRVar5 = (Resampler *)operator_new(0x70);
    Resampler(pRVar5,uVar15,uVar16,1);
    this->slave_left_ = pRVar5;
    pRVar5 = (Resampler *)operator_new(0x70);
    Resampler(pRVar5,uVar15,uVar16,1);
    this->slave_right_ = pRVar5;
  }
  RVar4 = kResamplerMode1To1;
  if (uVar15 != uVar16) {
    if (uVar15 == 1) {
      uVar16 = uVar16 - 2;
      if (10 < uVar16) {
        return -1;
      }
      if ((0x417U >> (uVar16 & 0x1f) & 1) == 0) {
        return -1;
      }
      puVar13 = &DAT_0019ce94;
    }
    else {
      if (uVar16 != 1) {
        RVar4 = kResamplerMode2To3;
        if (uVar16 != 3 || (uVar15 ^ 2) != 0) {
          uVar12 = uVar16 ^ 0xb;
          RVar4 = kResamplerMode2To11;
          if ((((uVar15 ^ 2) != 0 || uVar12 != 0) &&
              (RVar4 = kResamplerMode4To11, uVar15 != 4 || uVar12 != 0)) &&
             (RVar4 = kResamplerMode8To11, uVar15 != 8 || uVar12 != 0)) {
            RVar4 = kResamplerMode3To2;
            if (uVar15 != 3 || (uVar16 ^ 2) != 0) {
              uVar15 = uVar15 ^ 0xb;
              RVar4 = kResamplerMode11To2;
              if ((((uVar16 ^ 2) != 0 || uVar15 != 0) &&
                  (RVar4 = kResamplerMode11To4, uVar16 != 4 || uVar15 != 0)) &&
                 ((RVar4 = kResamplerMode11To16, uVar16 != 0x10 || uVar15 != 0 &&
                  ((RVar4 = kResamplerMode11To32, uVar16 != 0x20 || uVar15 != 0 &&
                   (RVar4 = kResamplerMode11To8, uVar15 != 0 || uVar16 != 8)))))) {
                return -1;
              }
            }
          }
        }
        goto LAB_001463e6;
      }
      uVar16 = uVar15 - 2;
      if (10 < uVar16) {
        return -1;
      }
      if ((0x417U >> (uVar16 & 0x1f) & 1) == 0) {
        return -1;
      }
      puVar13 = &DAT_0019cec0;
    }
    RVar4 = *(ResamplerMode *)(puVar13 + (ulong)uVar16 * 4);
  }
LAB_001463e6:
  this->my_mode_ = RVar4;
  switch(RVar4) {
  case kResamplerMode1To2:
  case kResamplerMode2To1:
    puVar8 = (undefined8 *)malloc(0x20);
    this->state1_ = puVar8;
    goto LAB_001466a1;
  case kResamplerMode1To3:
    pWVar7 = (WebRtcSpl_State16khzTo48khz *)malloc(0x60);
    this->state1_ = pWVar7;
    goto LAB_0014672e;
  case kResamplerMode1To4:
  case kResamplerMode4To1:
    puVar8 = (undefined8 *)malloc(0x20);
    this->state1_ = puVar8;
    *puVar8 = 0;
    puVar8[1] = 0;
    puVar8[2] = 0;
    puVar8[3] = 0;
    goto LAB_00146693;
  case kResamplerMode1To6:
    puVar8 = (undefined8 *)malloc(0x20);
    this->state1_ = puVar8;
    *puVar8 = 0;
    puVar8[1] = 0;
    puVar8[2] = 0;
    puVar8[3] = 0;
    pWVar7 = (WebRtcSpl_State16khzTo48khz *)malloc(0x60);
    this->state2_ = pWVar7;
    goto LAB_0014672e;
  case kResamplerMode1To12:
    puVar8 = (undefined8 *)malloc(0x20);
    this->state1_ = puVar8;
    *puVar8 = 0;
    puVar8[1] = 0;
    puVar8[2] = 0;
    puVar8[3] = 0;
    puVar8 = (undefined8 *)malloc(0x20);
    this->state2_ = puVar8;
    *puVar8 = 0;
    puVar8[1] = 0;
    puVar8[2] = 0;
    puVar8[3] = 0;
    pWVar7 = (WebRtcSpl_State16khzTo48khz *)malloc(0x60);
    this->state3_ = pWVar7;
LAB_0014672e:
    WebRtcSpl_ResetResample16khzTo48khz(pWVar7);
    break;
  case kResamplerMode2To3:
    pWVar7 = (WebRtcSpl_State16khzTo48khz *)malloc(0x60);
    this->state1_ = pWVar7;
    WebRtcSpl_ResetResample16khzTo48khz(pWVar7);
    goto LAB_00146693;
  case kResamplerMode2To11:
    puVar8 = (undefined8 *)malloc(0x20);
    this->state1_ = puVar8;
    *puVar8 = 0;
    puVar8[1] = 0;
    puVar8[2] = 0;
    puVar8[3] = 0;
    state = (WebRtcSpl_State8khzTo22khz *)malloc(0x60);
    this->state2_ = state;
    goto LAB_0014678b;
  case kResamplerMode4To11:
    state = (WebRtcSpl_State8khzTo22khz *)malloc(0x60);
    this->state1_ = state;
LAB_0014678b:
    WebRtcSpl_ResetResample8khzTo22khz(state);
    break;
  case kResamplerMode8To11:
    state_00 = (WebRtcSpl_State16khzTo22khz *)malloc(0x40);
    this->state1_ = state_00;
    WebRtcSpl_ResetResample16khzTo22khz(state_00);
    break;
  case kResamplerMode11To16:
    puVar8 = (undefined8 *)malloc(0x20);
    this->state1_ = puVar8;
    *puVar8 = 0;
    puVar8[1] = 0;
    puVar8[2] = 0;
    puVar8[3] = 0;
    pWVar10 = (WebRtcSpl_State22khzTo16khz *)malloc(0x60);
    this->state2_ = pWVar10;
    goto LAB_001467a2;
  case kResamplerMode11To32:
    puVar8 = (undefined8 *)malloc(0x20);
    this->state1_ = puVar8;
    *puVar8 = 0;
    puVar8[1] = 0;
    puVar8[2] = 0;
    puVar8[3] = 0;
    pWVar10 = (WebRtcSpl_State22khzTo16khz *)malloc(0x60);
    this->state2_ = pWVar10;
    WebRtcSpl_ResetResample22khzTo16khz(pWVar10);
    goto LAB_00146657;
  case kResamplerMode3To1:
    pWVar6 = (WebRtcSpl_State48khzTo16khz *)malloc(0x80);
    this->state1_ = pWVar6;
    goto LAB_001466e4;
  case kResamplerMode6To1:
    pWVar6 = (WebRtcSpl_State48khzTo16khz *)malloc(0x80);
    this->state1_ = pWVar6;
    WebRtcSpl_ResetResample48khzTo16khz(pWVar6);
    goto LAB_00146693;
  case kResamplerMode12To1:
    pWVar6 = (WebRtcSpl_State48khzTo16khz *)malloc(0x80);
    this->state1_ = pWVar6;
    WebRtcSpl_ResetResample48khzTo16khz(pWVar6);
    puVar8 = (undefined8 *)malloc(0x20);
    this->state2_ = puVar8;
    *puVar8 = 0;
    puVar8[1] = 0;
    puVar8[2] = 0;
    puVar8[3] = 0;
LAB_00146657:
    puVar8 = (undefined8 *)malloc(0x20);
    this->state3_ = puVar8;
    goto LAB_001466a1;
  case kResamplerMode3To2:
    puVar8 = (undefined8 *)malloc(0x20);
    this->state1_ = puVar8;
    *puVar8 = 0;
    puVar8[1] = 0;
    puVar8[2] = 0;
    puVar8[3] = 0;
    pWVar6 = (WebRtcSpl_State48khzTo16khz *)malloc(0x80);
    this->state2_ = pWVar6;
LAB_001466e4:
    WebRtcSpl_ResetResample48khzTo16khz(pWVar6);
    break;
  case kResamplerMode11To2:
    pWVar9 = (WebRtcSpl_State22khzTo8khz *)malloc(0x80);
    this->state1_ = pWVar9;
    WebRtcSpl_ResetResample22khzTo8khz(pWVar9);
LAB_00146693:
    puVar8 = (undefined8 *)malloc(0x20);
    this->state2_ = puVar8;
LAB_001466a1:
    *puVar8 = 0;
    puVar8[1] = 0;
    puVar8[2] = 0;
    puVar8[3] = 0;
    break;
  case kResamplerMode11To4:
    pWVar9 = (WebRtcSpl_State22khzTo8khz *)malloc(0x80);
    this->state1_ = pWVar9;
    WebRtcSpl_ResetResample22khzTo8khz(pWVar9);
    break;
  case kResamplerMode11To8:
    pWVar10 = (WebRtcSpl_State22khzTo16khz *)malloc(0x60);
    this->state1_ = pWVar10;
LAB_001467a2:
    WebRtcSpl_ResetResample22khzTo16khz(pWVar10);
  }
  return 0;
}

Assistant:

int Resampler::ResetIfNeeded(int inFreq, int outFreq, size_t num_channels)
{
    int tmpInFreq_kHz = inFreq / 1000;
    int tmpOutFreq_kHz = outFreq / 1000;

    if ((tmpInFreq_kHz != my_in_frequency_khz_) || (tmpOutFreq_kHz != my_out_frequency_khz_)
            || (num_channels != num_channels_))
    {
        return Reset(inFreq, outFreq, num_channels);
    } else
    {
        return 0;
    }
}